

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roll-parser.cpp
# Opt level: O2

int __thiscall ORPG::ExpressionTree::parse_tree(ExpressionTree *this,parse_node *node)

{
  short sVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  Die *pDVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ExpressionTree *pEVar11;
  size_t __nmemb;
  long lVar12;
  bool bVar13;
  float fVar14;
  
  if (node == (parse_node *)0x0) {
    return 0;
  }
  sVar1 = node->op;
  uVar8 = (ulong)(uint)(int)sVar1;
  if ((int)sVar1 == 0) {
    if (node->value == 0) {
      return 0;
    }
    uVar8 = 0;
LAB_00104115:
    if ((char)Core::VB_FLAG == '\x01') {
      fprintf(_stderr,"Expression Parse Error: Invalid option - %c\n",uVar8);
    }
    exit(1);
  }
  switch(sVar1) {
  case 1:
    iVar3 = node->value;
    goto LAB_00103f59;
  case 2:
    if (node->left == (parse_node *)0x0) {
      iVar2 = 1;
    }
    else {
      iVar2 = parse_tree(this,node->left);
    }
    iVar4 = parse_tree(this,node->right);
    if (iVar2 == 0) {
LAB_00103fe1:
      iVar3 = 0;
      goto LAB_00103f59;
    }
    if (2 < iVar4 + 1U) {
      this = (ExpressionTree *)operator_new(4);
      iVar3 = 2;
      if (2 < iVar4) {
        iVar3 = iVar4;
      }
      this->globalReadOffset = iVar3;
      iVar3 = 0;
      if (iVar2 < 1) {
        iVar2 = 0;
      }
      while (bVar13 = iVar2 != 0, iVar2 = iVar2 + -1, bVar13) {
        pEVar11 = this;
        iVar4 = Die::roll((Die *)this);
        iVar3 = checked_sum(pEVar11,iVar3,iVar4);
      }
LAB_00104109:
      operator_delete__(this);
      goto LAB_00103f59;
    }
    goto LAB_00103fd8;
  case 3:
    iVar4 = parse_tree(this,node->left);
    iVar3 = parse_tree(this,node->right);
    iVar3 = iVar3 * iVar4;
    goto LAB_00103f59;
  case 4:
    iVar3 = parse_tree(this,node->left);
    iVar4 = parse_tree(this,node->right);
    fVar14 = ceilf((float)iVar3 / (float)iVar4);
    iVar3 = (int)fVar14;
    goto LAB_00103f59;
  case 5:
    iVar3 = parse_tree(this,node->left);
    iVar4 = parse_tree(this,node->right);
    break;
  case 6:
    iVar3 = parse_tree(this,node->left);
    iVar4 = parse_tree(this,node->right);
    iVar4 = -iVar4;
    break;
  case 7:
    iVar3 = parse_tree(this,node->left);
    iVar4 = parse_tree(this,node->right);
    iVar3 = iVar3 % iVar4;
    goto LAB_00103f59;
  case 8:
    uVar5 = parse_tree(this,node->left->left);
    iVar2 = parse_tree(this,node->right);
    iVar4 = parse_tree(this,node->left->right);
    if (uVar5 == 0) goto LAB_00103fe1;
    if (2 < iVar4 + 1U) {
      __nmemb = (size_t)(int)uVar5;
      uVar9 = 0;
      uVar8 = 0xffffffffffffffff;
      if (-1 < (int)uVar5) {
        uVar8 = __nmemb * 4;
      }
      uVar10 = 0;
      if (0 < (int)uVar5) {
        uVar10 = (ulong)uVar5;
      }
      this = (ExpressionTree *)operator_new__(uVar8);
      pDVar7 = (Die *)operator_new(4);
      iVar3 = 2;
      if (2 < iVar4) {
        iVar3 = iVar4;
      }
      pDVar7->_MAX = iVar3;
      for (; uVar10 != uVar9; uVar9 = uVar9 + 1) {
        iVar3 = Die::roll(pDVar7);
        (&this->globalReadOffset)[uVar9] = iVar3;
      }
      operator_delete(pDVar7);
      pEVar11 = this;
      qsort(this,__nmemb,4,compare);
      iVar3 = 0;
      for (lVar12 = (long)(int)(uVar5 - iVar2); lVar12 < (long)__nmemb; lVar12 = lVar12 + 1) {
        iVar3 = checked_sum(pEVar11,iVar3,(&this->globalReadOffset)[lVar12]);
      }
      goto LAB_00104109;
    }
LAB_00103fd8:
    iVar3 = 0;
    break;
  case 9:
    uVar5 = parse_tree(this,node->left->left);
    uVar6 = parse_tree(this,node->right);
    iVar4 = parse_tree(this,node->left->right);
    if (uVar5 == 0) goto LAB_00103fe1;
    if (2 < iVar4 + 1U) {
      uVar9 = 0;
      uVar8 = 0xffffffffffffffff;
      if (-1 < (int)uVar5) {
        uVar8 = (long)(int)uVar5 * 4;
      }
      uVar10 = (ulong)uVar5;
      if ((int)uVar5 < 1) {
        uVar10 = uVar9;
      }
      this = (ExpressionTree *)operator_new__(uVar8);
      pDVar7 = (Die *)operator_new(4);
      iVar3 = 2;
      if (2 < iVar4) {
        iVar3 = iVar4;
      }
      pDVar7->_MAX = iVar3;
      for (; uVar10 != uVar9; uVar9 = uVar9 + 1) {
        iVar3 = Die::roll(pDVar7);
        (&this->globalReadOffset)[uVar9] = iVar3;
      }
      operator_delete(pDVar7);
      pEVar11 = this;
      qsort(this,(long)(int)uVar5,4,compare);
      uVar9 = 0;
      uVar8 = (ulong)uVar6;
      if ((int)uVar6 < 1) {
        uVar8 = uVar9;
      }
      iVar3 = 0;
      for (; uVar8 != uVar9; uVar9 = uVar9 + 1) {
        iVar3 = checked_sum(pEVar11,iVar3,(&this->globalReadOffset)[uVar9]);
      }
      goto LAB_00104109;
    }
    iVar3 = 0;
    break;
  case 10:
    iVar3 = parse_tree(this,node->right);
    do {
      pEVar11 = this;
      iVar4 = parse_tree(this,node->left);
    } while (iVar4 <= iVar3);
    goto LAB_00103f4e;
  case 0xb:
    iVar3 = parse_tree(this,node->right);
    do {
      pEVar11 = this;
      iVar4 = parse_tree(this,node->left);
    } while (iVar4 < iVar3);
    goto LAB_00103f4e;
  case 0xc:
    iVar3 = parse_tree(this,node->right);
    do {
      pEVar11 = this;
      iVar4 = parse_tree(this,node->left);
    } while (iVar3 <= iVar4);
    goto LAB_00103f4e;
  case 0xd:
    iVar3 = parse_tree(this,node->right);
    do {
      pEVar11 = this;
      iVar4 = parse_tree(this,node->left);
    } while (iVar3 < iVar4);
LAB_00103f4e:
    iVar3 = 0;
    this = pEVar11;
    break;
  case 0xe:
    iVar3 = parse_tree(this,node->right);
    do {
      iVar4 = parse_tree(this,node->left);
    } while (iVar4 == iVar3);
    return 0;
  default:
    if (sVar1 == -1) {
      return 0;
    }
    goto LAB_00104115;
  }
  iVar3 = checked_sum(this,iVar3,iVar4);
LAB_00103f59:
  iVar3 = checked_sum(this,0,iVar3);
  return iVar3;
}

Assistant:

int ExpressionTree::parse_tree(struct parse_node* node) {
        int high;
        int i;
        int limit;
        int low;
        int size;
        int reps;
        int tmp;
        int* results;
        Die* die;

        int ret = 0;

        /* sets our current node to node */
        auto curr = node;

        int sum = 0;

        if(!curr || (!curr->op && !curr->value)) {
            return 0;
        }

        switch(curr->op) {
        // error node
        case OP_ERR: {
            return 0;
        } break;

        // number node
        case OP_NUMBER: {
            sum = curr->value;
        } break;

        // n-sided die node
        case OP_DIE: {
            reps = curr->left ? parse_tree(curr->left) : 1;
            size = parse_tree(curr->right);

            if(reps == 0) {
                break;
            }

            if(size < 2 && size > -2) {
                sum = checked_sum(sum, size);
                break;
            }

            die = new Die(size); 
            
            for(i = 0; i < reps; i++) {
                sum = checked_sum(sum, die->roll());
            }
            
            delete[] die;
        } break;

        // multiplication node
        case OP_TIMES: {
            sum = checked_multiplication(parse_tree(curr->left),
                                         parse_tree(curr->right));
        } break;

        // integer division node
        case OP_DIV: {
            sum = (int)
            ceil((float)parse_tree(curr->left) /
                        parse_tree(curr->right));
        } break;
        
        // addition node
        case OP_PLUS: {
            sum = checked_sum(parse_tree(curr->left),
                              parse_tree(curr->right));
        } break;
        
        // subtraction node
        case OP_MINUS: {
            sum = checked_sum(parse_tree(curr->left),
                             -parse_tree(curr->right));
        } break;

        // modulo node
        case OP_MOD: {
            sum = parse_tree(curr->left) % parse_tree(curr->right);
        } break;
        
        // keep highest results node
        case OP_HIGH: {
            reps = parse_tree(curr->left->left);
            high = parse_tree(curr->right);
            size = parse_tree(curr->left->right);

            if(reps == 0) {
                break;
            }

            if(size < 2 && size > -2) {
                sum = checked_sum(sum, size);
                break;
            }

            // array to store the results to sort
            if (!(results = new int[reps])) {
                printf("out of memory");
                break;
            }
        
            Die* die = new Die(size);

            for(i = 0; i < reps; i++) {
                results[i] = die->roll();
            }

            delete die;

            qsort(results, reps, sizeof(int), &compare);

            for(i = (reps - high); i < reps; i++) {
                sum = checked_sum(sum, results[i]);
            }
        
            delete[] results;
        } break;
            
        // keep lowest resutls node
        case OP_LOW: {
            reps    = parse_tree(curr->left->left);
            low     = parse_tree(curr->right);
            size    = parse_tree(curr->left->right);

            if(reps == 0) {
                break;
            }

            if(size < 2 && size > -2) {
                sum = checked_sum(sum, size);
                break;
            }
                    
            /* array to store the results to sort */
            if (!(results = new int[reps])) {
                printf("out of memory");
                break;
            }
        
            Die* die = new Die(size);

            for(i = 0; i < reps; i++) {
                results[i] = die->roll();
            }

            delete die;

            qsort(results, reps, sizeof(int), &compare);
        
            for(i = 0; i < low; i++) {
                sum = checked_sum(sum, results[i]);
            }
        
            delete[] results;
        } break;

        // keep results greater than
        case OP_GT: {
            limit = parse_tree(curr->right);      
            tmp   = parse_tree(curr->left);
                
            while (tmp <= limit) {
                tmp = parse_tree(curr->left);
            }
                
            sum = checked_sum(sum, tmp);
        } break;

        // keep results greater or equal than
        case OP_GE: {
            limit = parse_tree(curr->right);      
            tmp   = parse_tree(curr->left);
            
            while (tmp < limit) {
                tmp = parse_tree(curr->left);
            }
        
            sum = checked_sum( sum, tmp );
        } break;
            
        // keep results less than
        case OP_LT: {
            limit = parse_tree(curr->right);      
            tmp   = parse_tree(curr->left);
        
            while (tmp >= limit) {
                tmp = parse_tree(curr->left);
            }
        
            sum = checked_sum(sum, tmp);
        
        } break;
        
        // keep results less or equal than
        case OP_LE: {
            limit = parse_tree(curr->right);      
            tmp   = parse_tree(curr->left);
        
            while (tmp > limit) {
                tmp = parse_tree(curr->left);
            }
        
            sum = checked_sum(sum, tmp);
        } break;
        
        // keep result not equal to
        case OP_NE: {
            limit = parse_tree(curr->right);      
            tmp   = parse_tree(curr->left);
        
            while (tmp == limit) {
                tmp = parse_tree(curr->left);      
            }
        
            return ret;
        } break;

        default: {
            if(Core::VB_FLAG) fprintf(stderr, "Expression Parse Error: Invalid option - %c\n", curr->op);
            exit(EXIT_FAILURE);
        }
        }

        ret = checked_sum(ret, sum);

        return ret;
    }